

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

stbi_uc * hdr_to_ldr(float *data,int x,int y,int comp)

{
  float fVar1;
  uint uVar2;
  stbi_uc *psVar3;
  long lVar4;
  uint uVar5;
  stbi_uc *psVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  float *pfVar10;
  ulong uVar11;
  float fVar12;
  double dVar13;
  
  uVar5 = x * y;
  psVar3 = (stbi_uc *)malloc((long)(int)(uVar5 * comp));
  if (psVar3 == (stbi_uc *)0x0) {
    free(data);
    failure_reason = "Out of memory";
  }
  else {
    if (0 < (int)uVar5) {
      uVar8 = (comp + (comp & 1U)) - 1;
      lVar7 = (long)comp;
      uVar11 = 0;
      psVar6 = psVar3;
      pfVar10 = data;
      do {
        uVar2 = 0;
        if (0 < (int)uVar8) {
          uVar9 = 0;
          do {
            dVar13 = pow((double)(pfVar10[uVar9] * h2l_scale_i),(double)h2l_gamma_i);
            fVar12 = (float)dVar13 * 255.0 + 0.5;
            fVar1 = 0.0;
            if (0.0 <= fVar12) {
              fVar1 = fVar12;
            }
            fVar12 = 255.0;
            if (fVar1 <= 255.0) {
              fVar12 = fVar1;
            }
            psVar6[uVar9] = (stbi_uc)(int)fVar12;
            uVar9 = uVar9 + 1;
            uVar2 = uVar8;
          } while (uVar8 != uVar9);
        }
        if ((int)uVar2 < comp) {
          lVar4 = (ulong)uVar2 + uVar11 * lVar7;
          fVar12 = data[lVar4] * 255.0 + 0.5;
          fVar1 = 0.0;
          if (0.0 <= fVar12) {
            fVar1 = fVar12;
          }
          fVar12 = 255.0;
          if (fVar1 <= 255.0) {
            fVar12 = fVar1;
          }
          psVar3[lVar4] = (stbi_uc)(int)fVar12;
        }
        uVar11 = uVar11 + 1;
        pfVar10 = pfVar10 + lVar7;
        psVar6 = psVar6 + lVar7;
      } while (uVar11 != uVar5);
    }
    free(data);
  }
  return psVar3;
}

Assistant:

static stbi_uc *hdr_to_ldr(float   *data, int x, int y, int comp)
{
   int i,k,n;
   stbi_uc *output = (stbi_uc *) malloc(x * y * comp);
   if (output == NULL) { free(data); return epuc("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         float z = (float) pow(data[i*comp+k]*h2l_scale_i, h2l_gamma_i) * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = float2int(z);
      }
      if (k < comp) {
         float z = data[i*comp+k] * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = float2int(z);
      }
   }
   free(data);
   return output;
}